

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

bool deqp::gles2::Functional::typeContainsMatchingBasicType
               (VarType *type,dataTypePredicate predicate)

{
  StructType *pSVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  pointer pSVar5;
  long lVar6;
  long lVar7;
  
  for (; type->m_type == TYPE_ARRAY; type = (type->m_data).array.elementType) {
  }
  if (type->m_type != TYPE_BASIC) {
    pSVar1 = (type->m_data).structPtr;
    pSVar5 = (pSVar1->m_members).
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = (int)((ulong)((long)(pSVar1->m_members).
                                super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5) >> 3) *
            -0x49249249;
    bVar2 = 0 < iVar3;
    if (0 < iVar3) {
      lVar6 = 0x20;
      lVar7 = 0;
      do {
        bVar2 = typeContainsMatchingBasicType
                          ((VarType *)((long)&(pSVar5->m_name)._M_dataplus._M_p + lVar6),predicate);
        if (bVar2) {
          return true;
        }
        lVar7 = lVar7 + 1;
        pSVar5 = (pSVar1->m_members).
                 super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar4 = (long)((int)((ulong)((long)(pSVar1->m_members).
                                           super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5
                                    ) >> 3) * -0x49249249);
        lVar6 = lVar6 + 0x38;
        bVar2 = lVar7 < lVar4;
      } while (lVar7 < lVar4);
    }
    return bVar2;
  }
  bVar2 = (*predicate)((type->m_data).basic.type);
  return bVar2;
}

Assistant:

static bool typeContainsMatchingBasicType (const glu::VarType& type, const dataTypePredicate predicate)
{
	if (type.isBasicType())
		return predicate(type.getBasicType());
	else if (type.isArrayType())
		return typeContainsMatchingBasicType(type.getElementType(), predicate);
	else
	{
		DE_ASSERT(type.isStructType());
		const StructType& structType = *type.getStructPtr();
		for (int i = 0; i < structType.getNumMembers(); i++)
			if (typeContainsMatchingBasicType(structType.getMember(i).getType(), predicate))
				return true;
		return false;
	}
}